

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_client_request.cxx
# Opt level: O1

ptr<resp_msg> __thiscall
nuraft::raft_server::handle_cli_req
          (raft_server *this,req_msg *req,req_ext_params *ext_params,uint64_t timestamp_us)

{
  __weak_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  mutex *__mutex;
  _Rb_tree_header *p_Var2;
  char cVar3;
  uint uVar4;
  __int_type_conflict _Var5;
  long lVar6;
  ulong *puVar7;
  element_type *peVar8;
  element_type *peVar9;
  element_type *peVar10;
  context *pcVar11;
  size_t us;
  _func_int **pp_Var12;
  undefined8 uVar13;
  undefined8 uVar14;
  int iVar15;
  int iVar16;
  ReturnCode RVar17;
  element_type *peVar18;
  undefined4 extraout_var;
  debugging_options *pdVar19;
  _Base_ptr p_Var20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var21;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  ulong uVar22;
  _Base_ptr p_Var23;
  __pthread_internal_list *in_R8;
  raft_server *prVar24;
  element_type *peVar25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp_2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var26;
  long lVar27;
  ptr<resp_msg> pVar28;
  ulong last_idx;
  req_ext_cb_params cb_params;
  ptr<commit_ret_elem> elem;
  ptr<buffer> buf;
  ptr<raft_params> params;
  EventAwaiter *local_158;
  element_type *local_150;
  undefined1 local_148 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_120;
  raft_server *local_118;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_110;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_108;
  undefined1 local_f9;
  element_type *local_f8;
  undefined1 local_f0 [24];
  _Any_data local_d8;
  undefined8 local_c8;
  __weak_count<(__gnu_cxx::_Lock_policy)2> *local_c0;
  undefined1 local_b8 [32];
  function<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_()>
  local_98;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  EventAwaiter *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_150 = (element_type *)0x0;
  local_f8 = (element_type *)req[9].super_msg_base._vptr_msg_base[1];
  local_118 = (raft_server *)req;
  local_d8._8_8_ = in_R8;
  context::get_params((context *)&stack0xffffffffffffffc0);
  peVar18 = (element_type *)operator_new(0xb0);
  (peVar18->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x100000001;
  peVar18->_vptr_raft_server = (_func_int **)&PTR___Sp_counted_ptr_inplace_005c4200;
  p_Var1 = &(peVar18->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
            super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  uVar4 = *(uint *)&(((vector<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                       *)&local_118->id_)->
                    super__Vector_base<std::shared_ptr<nuraft::log_entry>,_std::allocator<std::shared_ptr<nuraft::log_entry>_>_>
                    )._M_impl.super__Vector_impl_data._M_start;
  _Var21._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar4;
  _Var5 = (local_118->leader_).super___atomic_base<int>._M_i;
  (peVar18->bg_commit_thread_)._M_id._M_thread = (native_handle_type)local_f8;
  *(undefined4 *)&(peVar18->bg_append_thread_)._M_id._M_thread = 4;
  *(uint *)((long)&(peVar18->bg_append_thread_)._M_id._M_thread + 4) = uVar4;
  *(__int_type_conflict *)&peVar18->bg_append_ea_ = _Var5;
  (peVar18->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
  super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&PTR__resp_msg_005c4250;
  (peVar18->priority_change_timer_).t_created_.__d.__r = 0;
  (peVar18->priority_change_timer_).duration_us_ = 0;
  *(undefined8 *)&(peVar18->priority_change_timer_).first_event_fired_ = 0;
  (peVar18->priority_change_timer_).lock_.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(peVar18->priority_change_timer_).lock_.super___mutex_base._M_mutex + 8) =
       0;
  *(undefined8 *)((long)&(peVar18->priority_change_timer_).lock_.super___mutex_base._M_mutex + 0x10)
       = 0;
  (peVar18->priority_change_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (peVar18->priority_change_timer_).lock_.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  peVar18->votes_responded_ = 0;
  peVar18->votes_granted_ = 0;
  (peVar18->precommit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (peVar18->leader_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  (peVar18->quick_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined4 *)&(peVar18->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0;
  *(undefined8 *)&(peVar18->initialized_)._M_base = 0;
  peVar18->id_ = 0;
  peVar18->my_priority_ = 0;
  *(undefined1 *)&peVar18->target_priority_ = 0;
  if (((local_118->role_)._M_i == leader) && (((local_118->write_paused_)._M_base._M_i & 1U) == 0))
  {
    peVar25 = *(element_type **)(timestamp_us + 0x20);
    _Var21._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   CONCAT71((int7)((ulong)peVar25 >> 8),
                            peVar25 == local_f8 || peVar25 == (element_type *)0x0);
    if (peVar25 != local_f8 && peVar25 != (element_type *)0x0) {
      *(undefined4 *)&(peVar18->sm_commit_index_).super___atomic_base<unsigned_long>._M_i =
           0xfffffff5;
      goto LAB_001940d1;
    }
    local_b8._8_8_ =
         *(__int_type *)((long)&ext_params[1].after_precommit_.super__Function_base._M_functor + 8);
    local_b8._0_8_ = ext_params[1].after_precommit_.super__Function_base._M_manager;
    local_c8 = (long)(local_b8._0_8_ - local_b8._8_8_) >> 4;
    prVar24 = local_118;
    local_120._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18;
    local_d8._M_unused._M_object = this;
    local_c0 = p_Var1;
    if (local_b8._0_8_ == local_b8._8_8_) {
      peVar18 = (element_type *)0x0;
      local_158 = (EventAwaiter *)0x0;
    }
    else {
      local_b8._16_8_ =
           (long)&((__pthread_internal_list *)local_c8)->__prev +
           (ulong)((__pthread_internal_list *)local_c8 == (__pthread_internal_list *)0x0);
      lVar27 = 0;
      uVar22 = 0;
      peVar25 = (element_type *)0x0;
      local_b8._24_8_ = timestamp_us;
      do {
        lVar6 = *(long *)((long)&ext_params[1].after_precommit_.super__Function_base._M_functor + 8)
        ;
        if ((ulong)((long)ext_params[1].after_precommit_.super__Function_base._M_manager - lVar6 >>
                   4) <= uVar22) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar22);
LAB_001949ad:
          iVar15 = std::__throw_out_of_range_fmt
                             ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                              ,uVar22);
          goto LAB_001949c2;
        }
        puVar7 = *(ulong **)(lVar6 + lVar27);
        *puVar7 = (ulong)local_f8;
        puVar7[4] = local_d8._8_8_;
        peVar18 = (element_type *)store_log_entry(prVar24,(ptr<log_entry> *)(lVar6 + lVar27),0);
        peVar8 = (prVar24->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        if ((peVar8 != (element_type *)0x0) && (iVar15 = (*peVar8->_vptr_logger[7])(), 4 < iVar15))
        {
          peVar8 = (prVar24->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)local_148,"append at log_idx %lu, timestamp %lu",peVar18,
                     local_d8._8_8_);
          (*peVar8->_vptr_logger[8])
                    (peVar8,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                     ,"handle_cli_req",0x7b,(string *)local_148);
          prVar24 = local_118;
          if ((_Base_ptr)local_148._0_8_ != (_Base_ptr)(local_148 + 0x10)) {
            operator_delete((void *)local_148._0_8_);
          }
        }
        lVar6 = *(long *)((long)&ext_params[1].after_precommit_.super__Function_base._M_functor + 8)
        ;
        local_150 = peVar18;
        if ((ulong)((long)ext_params[1].after_precommit_.super__Function_base._M_manager - lVar6 >>
                   4) <= uVar22) goto LAB_001949ad;
        lVar6 = *(long *)(lVar6 + lVar27);
        local_f0._0_8_ = *(undefined8 *)(lVar6 + 0x10);
        local_f0._8_8_ = *(long *)(lVar6 + 0x18);
        if ((_Base_ptr)local_f0._8_8_ != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&((_Base_ptr)local_f0._8_8_)->_M_parent =
                 *(int *)&((_Base_ptr)local_f0._8_8_)->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&((_Base_ptr)local_f0._8_8_)->_M_parent =
                 *(int *)&((_Base_ptr)local_f0._8_8_)->_M_parent + 1;
          }
        }
        buffer::pos((buffer *)local_f0._0_8_,0);
        peVar9 = (prVar24->state_machine_).
                 super___shared_ptr<nuraft::state_machine,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150;
        local_108._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0;
        (*peVar9->_vptr_state_machine[6])(local_148,peVar9,&local_110);
        peVar18 = (element_type *)local_148._8_8_;
        local_158 = (EventAwaiter *)local_148._0_8_;
        local_148._0_8_ = (_Base_ptr)0x0;
        local_148._8_8_ = (element_type *)0x0;
        if (peVar25 != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar25);
        }
        if ((element_type *)local_148._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
        }
        if (((__pthread_internal_list *)(local_b8._24_8_ + 0x10))->__prev !=
            (__pthread_internal_list *)0x0) {
          local_148._0_8_ = local_150;
          local_148._8_8_ = local_f8;
          local_148._16_8_ = ((__pthread_internal_list *)(local_b8._24_8_ + 0x20))->__next;
          (*(code *)((__pthread_internal_list *)(local_b8._24_8_ + 0x10))->__next)
                    (local_b8._24_8_,local_148);
        }
        if ((_Base_ptr)local_f0._8_8_ != (_Base_ptr)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f0._8_8_);
        }
        uVar22 = uVar22 + 1;
        lVar27 = lVar27 + 0x10;
        peVar25 = peVar18;
      } while (local_b8._16_8_ != uVar22);
    }
    this = (raft_server *)local_d8._M_unused._0_8_;
    if (local_b8._0_8_ != local_b8._8_8_) {
      peVar10 = (prVar24->log_store_).
                super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (*peVar10->_vptr_log_store[7])(peVar10,(long)local_150 - local_c8);
    }
    try_update_precommit_index(prVar24,(ulong)local_150,10);
    iVar16 = (*((prVar24->log_store_).
                super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               _vptr_log_store[2])();
    _Var26._M_pi = local_120._M_pi;
    local_f0._4_4_ = (prVar24->leader_).super___atomic_base<int>._M_i;
    local_f0._0_4_ = prVar24->id_;
    local_f0._8_4_ = 0xffffffff;
    local_f0._16_8_ = &local_150;
    pcVar11 = (prVar24->ctx_)._M_t.
              super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
              super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
              super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
    if ((pcVar11->cb_func_).func.super__Function_base._M_manager != (_Manager_type)0x0) {
      local_110._M_pi._0_4_ = 3;
      local_148._0_8_ = local_f0;
      RVar17 = (*(pcVar11->cb_func_).func._M_invoker)
                         ((_Any_data *)&pcVar11->cb_func_,(Type *)&local_110,(Param **)local_148);
      if (RVar17 == ReturnNull) {
        this->_vptr_raft_server = 0;
        (((enable_shared_from_this<nuraft::raft_server> *)((long)this + 8))->_M_weak_this).
        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        _Var21._M_pi = extraout_RDX_02;
        goto LAB_001940df;
      }
    }
    pdVar19 = debugging_options::get_instance();
    us = (pdVar19->handle_cli_req_sleep_us_).super___atomic_base<unsigned_long>._M_i;
    if (us != 0) {
      timer_helper::sleep_us(us);
    }
    get_config((raft_server *)local_148);
    cVar3 = *(char *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_148._0_8_ + 0x10))->
                      _vptr__Sp_counted_base;
    if ((element_type *)local_148._8_8_ != (element_type *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
    }
    if (cVar3 == '\0') {
      local_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<nuraft::raft_server::commit_ret_elem,std::allocator<nuraft::raft_server::commit_ret_elem>>
                (&local_108,(commit_ret_elem **)&local_110,
                 (allocator<nuraft::raft_server::commit_ret_elem> *)local_148);
      prVar24 = local_118;
      (local_110._M_pi)->_vptr__Sp_counted_base = (_func_int **)local_150;
      local_110._M_pi[0xb]._M_use_count = -2;
      __mutex = &local_118->commit_ret_elems_lock_;
      iVar15 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar15 != 0) {
LAB_001949c2:
        std::__throw_system_error(iVar15);
      }
      p_Var2 = &(prVar24->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header;
      p_Var23 = (prVar24->commit_ret_elems_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var20 = &p_Var2->_M_header;
      for (; p_Var23 != (_Base_ptr)0x0;
          p_Var23 = (&p_Var23->_M_left)[*(element_type **)(p_Var23 + 1) < local_150]) {
        if (*(element_type **)(p_Var23 + 1) >= local_150) {
          p_Var20 = p_Var23;
        }
      }
      p_Var23 = &p_Var2->_M_header;
      if (((_Rb_tree_header *)p_Var20 != p_Var2) &&
         (p_Var23 = p_Var20, local_150 < *(element_type **)(p_Var20 + 1))) {
        p_Var23 = &p_Var2->_M_header;
      }
      if ((_Rb_tree_header *)p_Var23 == p_Var2) {
        local_148._0_8_ = local_150;
        local_148._8_8_ = local_110._M_pi;
        local_148._16_8_ = local_108._M_pi;
        if (local_108._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_108._M_pi)->_M_use_count = (local_108._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_108._M_pi)->_M_use_count = (local_108._M_pi)->_M_use_count + 1;
          }
        }
        std::
        _Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>>
        ::
        _M_emplace_unique<std::pair<unsigned_long,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>
                  ((_Rb_tree<unsigned_long,std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>,std::_Select1st<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>,std::less<unsigned_long>,std::allocator<std::pair<unsigned_long_const,std::shared_ptr<nuraft::raft_server::commit_ret_elem>>>>
                    *)&prVar24->commit_ret_elems_,
                   (pair<unsigned_long,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>_> *)
                   local_148);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._16_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._16_8_);
        }
      }
      else {
        local_110._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var23[1]._M_parent;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_108,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&p_Var23[1]._M_left);
        peVar8 = (prVar24->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        if ((peVar8 != (element_type *)0x0) && (iVar15 = (*peVar8->_vptr_logger[7])(), 5 < iVar15))
        {
          peVar8 = (prVar24->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)local_148,"commit thread was faster than this thread: %p",
                     local_110._M_pi);
          (*peVar8->_vptr_logger[8])
                    (peVar8,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                     ,"handle_cli_req",0xaa,local_148);
          if ((_Base_ptr)local_148._0_8_ != (_Base_ptr)(local_148 + 0x10)) {
            operator_delete((void *)local_148._0_8_);
          }
        }
      }
      context::get_params((context *)local_148);
      iVar15 = *(int *)(local_148._0_8_ + 0x58);
      if ((element_type *)local_148._8_8_ != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
      }
      _Var26._M_pi = local_108._M_pi;
      _Var21._M_pi = local_110._M_pi;
      if (iVar15 == 1) {
        if (*(_func_int ***)&((_Base_ptr)(local_110._M_pi + 0xc))->_M_color == (_func_int **)0x0) {
          std::
          __shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>,(__gnu_cxx::_Lock_policy)2>
          ::
          __shared_ptr<std::allocator<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>>>
                    ((__shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,std::shared_ptr<std::exception>>,(__gnu_cxx::_Lock_policy)2>
                      *)local_148,
                     (allocator<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>
                      *)&local_f9);
          uVar14 = local_148._8_8_;
          uVar13 = local_148._0_8_;
          local_148._0_8_ = (_Base_ptr)0x0;
          local_148._8_8_ = (element_type *)0x0;
          p_Var23 = ((_Base_ptr)(local_110._M_pi + 0xc))->_M_parent;
          *(undefined8 *)&((_Base_ptr)(local_110._M_pi + 0xc))->_M_color = uVar13;
          ((_Base_ptr)(local_110._M_pi + 0xc))->_M_parent = (_Base_ptr)uVar14;
          if (p_Var23 != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)p_Var23);
          }
          if ((element_type *)local_148._8_8_ != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_148._8_8_);
          }
        }
        pp_Var12 = *(_func_int ***)&((_Base_ptr)(local_110._M_pi + 0xc))->_M_color;
        p_Var23 = ((_Base_ptr)(local_110._M_pi + 0xc))->_M_parent;
        if (p_Var23 != (_Base_ptr)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(int *)&p_Var23->_M_parent = *(int *)&p_Var23->_M_parent + 1;
            UNLOCK();
          }
          else {
            *(int *)&p_Var23->_M_parent = *(int *)&p_Var23->_M_parent + 1;
          }
        }
        local_98.super__Function_base._M_manager = (_Manager_type)0x0;
        local_98._M_invoker = (_Invoker_type)0x0;
        local_98.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
        local_98.super__Function_base._M_functor._8_8_ = 0;
        local_98.super__Function_base._M_functor._M_unused._M_object = operator_new(0x28);
        *(code **)local_98.super__Function_base._M_functor._M_unused._0_8_ =
             handle_cli_req_callback_async;
        *(undefined8 *)((long)local_98.super__Function_base._M_functor._M_unused._0_8_ + 8) = 0;
        *(_func_int ***)((long)local_98.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
             pp_Var12;
        *(_Base_ptr *)((long)local_98.super__Function_base._M_functor._M_unused._0_8_ + 0x18) =
             p_Var23;
        *(raft_server **)((long)local_98.super__Function_base._M_functor._M_unused._0_8_ + 0x20) =
             prVar24;
        local_98._M_invoker =
             std::
             _Function_handler<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_(),_std::_Bind<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>)>_>
             ::_M_invoke;
        local_98.super__Function_base._M_manager =
             std::
             _Function_handler<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_(),_std::_Bind<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>))(std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>)>_>
             ::_M_manager;
        std::
        function<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_()>
        ::operator=((function<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_()>
                     *)&local_120._M_pi[8]._M_use_count,&local_98);
        if (local_98.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_98.super__Function_base._M_manager)
                    ((_Any_data *)&local_98,(_Any_data *)&local_98,__destroy_functor);
        }
      }
      else {
        if (local_108._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_108._M_pi)->_M_use_count = (local_108._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_108._M_pi)->_M_use_count = (local_108._M_pi)->_M_use_count + 1;
          }
        }
        local_68 = (code *)0x0;
        pcStack_60 = (code *)0x0;
        local_78._M_unused._M_object = (void *)0x0;
        local_78._8_4_ = (__atomic_base<int>)0x0;
        local_78._12_4_ = (__atomic_base<int>)0x0;
        local_78._M_unused._M_object = operator_new(0x28);
        *(code **)local_78._M_unused._0_8_ = handle_cli_req_callback;
        *(undefined8 *)((long)local_78._M_unused._0_8_ + 8) = 0;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_78._M_unused._0_8_ + 0x10) =
             _Var21._M_pi;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)local_78._M_unused._0_8_ + 0x18) =
             _Var26._M_pi;
        *(raft_server **)((long)local_78._M_unused._0_8_ + 0x20) = prVar24;
        pcStack_60 = std::
                     _Function_handler<std::shared_ptr<nuraft::resp_msg>_(std::shared_ptr<nuraft::resp_msg>),_std::_Bind<std::shared_ptr<nuraft::resp_msg>_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::shared_ptr<nuraft::resp_msg>)>_>
                     ::_M_invoke;
        local_68 = std::
                   _Function_handler<std::shared_ptr<nuraft::resp_msg>_(std::shared_ptr<nuraft::resp_msg>),_std::_Bind<std::shared_ptr<nuraft::resp_msg>_(nuraft::raft_server::*(nuraft::raft_server_*,_std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::_Placeholder<1>))(std::shared_ptr<nuraft::raft_server::commit_ret_elem>,_std::shared_ptr<nuraft::resp_msg>)>_>
                   ::_M_manager;
        std::function<std::shared_ptr<nuraft::resp_msg>_(std::shared_ptr<nuraft::resp_msg>)>::
        operator=((function<std::shared_ptr<nuraft::resp_msg>_(std::shared_ptr<nuraft::resp_msg>)> *
                  )&local_120._M_pi[6]._M_use_count,
                  (function<std::shared_ptr<nuraft::resp_msg>_(std::shared_ptr<nuraft::resp_msg>)> *
                  )&local_78);
        if (local_68 != (code *)0x0) {
          (*local_68)(&local_78,&local_78,__destroy_functor);
        }
      }
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      _Var21._M_pi = extraout_RDX_05;
      this = (raft_server *)local_d8._M_unused._0_8_;
      _Var26._M_pi = local_120._M_pi;
      if (local_108._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_108._M_pi);
        _Var21._M_pi = extraout_RDX_06;
        this = (raft_server *)local_d8._M_unused._0_8_;
        _Var26._M_pi = local_120._M_pi;
      }
    }
    else {
      peVar8 = (local_118->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      ;
      if ((peVar8 != (element_type *)0x0) && (iVar15 = (*peVar8->_vptr_logger[7])(), 4 < iVar15)) {
        peVar8 = (local_118->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_148,"asynchronously replicated %lu, return value %p",local_150,
                   local_158);
        (*peVar8->_vptr_logger[8])
                  (peVar8,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_client_request.cxx"
                   ,"handle_cli_req",0xca,local_148);
        if ((_Base_ptr)local_148._0_8_ != (_Base_ptr)(local_148 + 0x10)) {
          operator_delete((void *)local_148._0_8_);
        }
      }
      local_50 = local_158;
      if (peVar18 != (element_type *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          *(int *)&(peVar18->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                   super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(peVar18->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
          ;
          UNLOCK();
        }
        else {
          *(int *)&(peVar18->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                   super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               *(int *)&(peVar18->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
                        super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1
          ;
        }
      }
      (((timer_helper *)&_Var26._M_pi[4]._M_use_count)->t_created_).__d.__r = (rep)local_158;
      local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(_Var26._M_pi + 5),&local_48);
      _Var21._M_pi = extraout_RDX_03;
      if ((element_type *)local_48._M_pi != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
        _Var21._M_pi = extraout_RDX_04;
      }
    }
    *(ulong *)&(((element_type *)_Var26._M_pi)->initialized_)._M_base =
         CONCAT44(extraout_var,iVar16);
    *(undefined1 *)&((element_type *)_Var26._M_pi)->target_priority_ = 1;
    this->_vptr_raft_server = (_func_int **)local_c0;
    (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)_Var26._M_pi;
  }
  else {
    *(undefined4 *)&(peVar18->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = 0xfffffffd
    ;
LAB_001940d1:
    this->_vptr_raft_server = (_func_int **)p_Var1;
    (this->super_enable_shared_from_this<nuraft::raft_server>)._M_weak_this.
    super___weak_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar18;
    peVar18 = (element_type *)0x0;
  }
  _Var26._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
LAB_001940df:
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
    _Var21._M_pi = extraout_RDX;
  }
  if (peVar18 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
    _Var21._M_pi = extraout_RDX_00;
  }
  if ((element_type *)_Var26._M_pi != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var26._M_pi);
    _Var21._M_pi = extraout_RDX_01;
  }
  pVar28.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var21._M_pi;
  pVar28.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ptr<resp_msg>)pVar28.super___shared_ptr<nuraft::resp_msg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<resp_msg> raft_server::handle_cli_req(req_msg& req,
                                          const req_ext_params& ext_params,
                                          uint64_t timestamp_us)
{
    ptr<resp_msg> resp = nullptr;
    ulong last_idx = 0;
    ptr<buffer> ret_value = nullptr;
    ulong resp_idx = 1;
    ulong cur_term = state_->get_term();
    ptr<raft_params> params = ctx_->get_params();

    resp = cs_new<resp_msg>( cur_term,
                             msg_type::append_entries_response,
                             id_,
                             leader_ );
    if (role_ != srv_role::leader || write_paused_) {
        resp->set_result_code( cmd_result_code::NOT_LEADER );
        return resp;
    }

    if (ext_params.expected_term_) {
        // If expected term is given, check the current term.
        if (ext_params.expected_term_ != cur_term) {
            resp->set_result_code( cmd_result_code::TERM_MISMATCH );
            return resp;
        }
    }

    std::vector< ptr<log_entry> >& entries = req.log_entries();
    size_t num_entries = entries.size();

    for (size_t i = 0; i < num_entries; ++i) {
        // force the log's term to current term
        entries.at(i)->set_term(cur_term);
        entries.at(i)->set_timestamp(timestamp_us);

        ulong next_slot = store_log_entry(entries.at(i));
        p_db("append at log_idx %" PRIu64 ", timestamp %" PRIu64,
             next_slot, timestamp_us);
        last_idx = next_slot;

        ptr<buffer> buf = entries.at(i)->get_buf_ptr();
        buf->pos(0);
        ret_value = state_machine_->pre_commit_ext
                    ( state_machine::ext_op_params( last_idx, buf ) );

        if (ext_params.after_precommit_) {
            req_ext_cb_params cb_params;
            cb_params.log_idx = last_idx;
            cb_params.log_term = cur_term;
            cb_params.context = ext_params.context_;
            ext_params.after_precommit_(cb_params);
        }
    }
    if (num_entries) {
        log_store_->end_of_append_batch(last_idx - num_entries, num_entries);
    }
    try_update_precommit_index(last_idx);
    resp_idx = log_store_->next_slot();

    // Finished appending logs and pre_commit of itself.
    cb_func::Param param(id_, leader_);
    param.ctx = &last_idx;
    CbReturnCode rc = ctx_->cb_func_.call(cb_func::AppendLogs, &param);
    if (rc == CbReturnCode::ReturnNull) return nullptr;

    size_t sleep_us = debugging_options::get_instance()
                      .handle_cli_req_sleep_us_.load(std::memory_order_relaxed);
    if (sleep_us) {
        // Sleep if the debugging option is given.
        timer_helper::sleep_us(sleep_us);
    }

    if (!get_config()->is_async_replication()) {
        // Sync replication:
        //   Set callback function for `last_idx`.
        ptr<commit_ret_elem> elem = cs_new<commit_ret_elem>();
        elem->idx_ = last_idx;
        elem->result_code_ = cmd_result_code::TIMEOUT;

        {   auto_lock(commit_ret_elems_lock_);
            auto entry = commit_ret_elems_.find(last_idx);
            if (entry != commit_ret_elems_.end()) {
                // Commit thread was faster than this.
                elem = entry->second;
                p_tr("commit thread was faster than this thread: %p", elem.get());
            } else {
                commit_ret_elems_.insert( std::make_pair(last_idx, elem) );
            }

            switch (ctx_->get_params()->return_method_) {
            case raft_params::blocking:
            default:
                // Blocking call: set callback function waiting for the result.
                resp->set_cb( std::bind( &raft_server::handle_cli_req_callback,
                                         this,
                                         elem,
                                         std::placeholders::_1 ) );
                break;

            case raft_params::async_handler:
                // Async handler: create & set async result object.
                if (!elem->async_result_) {
                    elem->async_result_ = cs_new< cmd_result< ptr<buffer> > >();
                }
                resp->set_async_cb
                      ( std::bind( &raft_server::handle_cli_req_callback_async,
                                   this,
                                   elem->async_result_ ) );
                break;
            }
        }

    } else {
        // Async replication:
        //   Immediately return with the result of pre-commit.
        p_dv( "asynchronously replicated %" PRIu64 ", return value %p",
              last_idx, ret_value.get() );
        resp->set_ctx(ret_value);
    }

    resp->accept(resp_idx);
    return resp;
}